

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_expression.cpp
# Opt level: O1

bool __thiscall duckdb::FunctionExpression::IsLambdaFunction(FunctionExpression *this)

{
  ExpressionClass EVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar2;
  int iVar3;
  pointer pPVar4;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  bool bVar5;
  
  iVar3 = ::std::__cxx11::string::compare((char *)&this->function_name);
  if (iVar3 == 0) {
    bVar5 = false;
  }
  else {
    this_00 = (this->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = this_00 != puVar2;
    if (bVar5) {
      pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_00);
      EVar1 = (pPVar4->super_BaseExpression).expression_class;
      while (EVar1 != LAMBDA) {
        this_00 = this_00 + 1;
        bVar5 = this_00 != puVar2;
        if (this_00 == puVar2) {
          return bVar5;
        }
        pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_00);
        EVar1 = (pPVar4->super_BaseExpression).expression_class;
      }
    }
  }
  return bVar5;
}

Assistant:

bool FunctionExpression::IsLambdaFunction() const {
	// Ignore the ->> operator (JSON extension).
	if (function_name == "->>") {
		return false;
	}
	// Check the children for lambda expressions.
	for (auto &child : children) {
		if (child->GetExpressionClass() == ExpressionClass::LAMBDA) {
			return true;
		}
	}
	return false;
}